

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtSourceHolder.cpp
# Opt level: O2

void __thiscall
Js::
JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
::EnsureSource(JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
               *this,MapRequestFor requestedFor,WCHAR *reasonString)

{
  ScriptContext *scriptContext;
  ThreadContext *pTVar1;
  code *pcVar2;
  _JsParseScriptAttributes _Var3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  undefined4 *puVar8;
  JsrtContext *pJVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 local_98 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  size_t sourceLength;
  utf8char_t *utf8Source;
  size_t utf8Length;
  size_t utf8AllocLength;
  Type *local_48;
  _JsParseScriptAttributes local_3c;
  JavascriptString *pJStack_38;
  JsParseScriptAttributes attributes;
  JsValueRef scriptVal;
  byte *script_;
  
  if ((this->mappedSource).ptr == (uchar *)0x0) {
    if (this->scriptLoadCallback == (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtSourceHolder.cpp"
                                  ,0xf0,"(scriptLoadCallback != nullptr)",
                                  "scriptLoadCallback != nullptr");
      if (!bVar4) goto LAB_003a90a4;
      *puVar8 = 0;
      if ((this->mappedSource).ptr != (uchar *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtSourceHolder.cpp"
                                    ,0xf1,"(this->mappedSource == nullptr)",
                                    "this->mappedSource == nullptr");
        if (!bVar4) goto LAB_003a90a4;
        *puVar8 = 0;
      }
    }
    local_3c = JsParseScriptAttributeNone;
    __leaveScriptObject.__exceptionCheck.handledExceptionType = ExceptionType_None;
    __leaveScriptObject._36_4_ = 0;
    sourceLength = 0;
    utf8Source = (utf8char_t *)0x0;
    utf8Length = 0;
    utf8AllocLength = (size_t)reasonString;
    local_48 = &this->mappedSource;
    pJVar9 = JsrtContext::GetCurrent();
    scriptContext =
         (((pJVar9->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_98,scriptContext,
               &stack0xfffffffffffffff8);
    pTVar1 = scriptContext->threadContext;
    bVar4 = pTVar1->reentrancySafeOrHandled;
    pTVar1->reentrancySafeOrHandled = true;
    bVar5 = (*this->scriptLoadCallback)(this->sourceContext,&stack0xffffffffffffffc8,&local_3c);
    if (!bVar5) {
      JavascriptError::ThrowOutOfMemoryError((ScriptContext *)0x0);
    }
    ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
    pTVar1->reentrancySafeOrHandled = bVar4;
    LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_98);
    bVar4 = VarIs<Js::ArrayBuffer>(pJStack_38);
    _Var3 = local_3c;
    if (bVar4) {
      iVar6 = (*(pJStack_38->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])();
      script_ = (byte *)CONCAT44(extraout_var,iVar6);
      uVar7 = (*(pJStack_38->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
    }
    else {
      bVar4 = VarIs<Js::JavascriptString>(pJStack_38);
      if (!bVar4) {
        JavascriptError::ThrowOutOfMemoryError((ScriptContext *)0x0);
      }
      iVar6 = (*(pJStack_38->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
      script_ = (byte *)CONCAT44(extraout_var_00,iVar6);
      uVar7 = JavascriptString::GetLength(pJStack_38);
    }
    JsrtSourceHolderPolicy<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*)>::
    ScriptToUtf8((ScriptContext *)0x0,script_,
                 (_Var3 & JsParseScriptAttributeArrayBufferIsUtf16Encoded) ==
                 JsParseScriptAttributeNone,(ulong)uVar7,(utf8char_t **)&sourceLength,
                 (size_t *)&utf8Source,(size_t *)&__leaveScriptObject.__exceptionCheck,&utf8Length,
                 true);
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->mappedScriptValue,pJStack_38);
    Memory::WriteBarrierPtr<const_unsigned_char>::WriteBarrierSet(local_48,(uchar *)sourceLength);
    this->mappedSourceByteLength = (Type)utf8Source;
    this->mappedAllocLength = utf8Length;
    this->scriptLoadCallback = (Type)0x0;
    if (utf8AllocLength == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtSourceHolder.cpp"
                                  ,0x124,"(reasonString != nullptr)",
                                  "Reason string for why we are mapping the source was not provided."
                                 );
      if (!bVar4) {
LAB_003a90a4:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
  }
  return;
}

Assistant:

void JsrtSourceHolder<JsSerializedLoadScriptCallback,
        JsSerializedScriptUnloadCallback>::EnsureSource(MapRequestFor requestedFor,
        const WCHAR* reasonString)
    {
        if (this->mappedSource != nullptr)
        {
            return;
        }

        Assert(scriptLoadCallback != nullptr);
        Assert(this->mappedSource == nullptr);

        JsValueRef scriptVal;
        JsParseScriptAttributes attributes = JsParseScriptAttributeNone;
        size_t sourceLength = 0;
        utf8char_t *utf8Source = nullptr;
        size_t utf8Length = 0;
        size_t utf8AllocLength = 0;

        Js::ScriptContext* scriptContext = JsrtContext::GetCurrent()->GetScriptContext();
        BEGIN_LEAVE_SCRIPT(scriptContext)
        if (!scriptLoadCallback(sourceContext, &scriptVal, &attributes))
        {
            // Assume out of memory
            Js::JavascriptError::ThrowOutOfMemoryError(nullptr);
        }
        END_LEAVE_SCRIPT(scriptContext);

        bool isExternalArray = Js::VarIs<Js::ArrayBuffer>(scriptVal),
             isString = false;
        bool isUtf8   = !(attributes & JsParseScriptAttributeArrayBufferIsUtf16Encoded);

        if (!isExternalArray)
        {
            isString = Js::VarIs<Js::JavascriptString>(scriptVal);
            if (!isString)
            {
                Js::JavascriptError::ThrowOutOfMemoryError(nullptr);
                return;
            }
        }

        const byte* script = isExternalArray ?
            ((Js::ExternalArrayBuffer*)(scriptVal))->GetBuffer() :
            (const byte*)((Js::JavascriptString*)(scriptVal))->GetSz();
        const size_t cb = isExternalArray ?
            ((Js::ExternalArrayBuffer*)(scriptVal))->GetByteLength() :
            ((Js::JavascriptString*)(scriptVal))->GetLength();

        JsrtSourceHolderPolicy<JsSerializedLoadScriptCallback>::ScriptToUtf8(nullptr,
            script, isUtf8, cb, &utf8Source, &utf8Length, &sourceLength,
            &utf8AllocLength, true);

        this->mappedScriptValue = scriptVal;
        this->mappedSource = utf8Source;
        this->mappedSourceByteLength = utf8Length;
        this->mappedAllocLength = utf8AllocLength;

        this->scriptLoadCallback = nullptr;

#if ENABLE_DEBUG_CONFIG_OPTIONS
        AssertMsg(reasonString != nullptr, "Reason string for why we are mapping the source was not provided.");
        JS_ETW(EventWriteJSCRIPT_SOURCEMAPPING(reasonString, (ushort)requestedFor));
#endif
    }